

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Welcome.cpp
# Opt level: O0

void Handlers::Welcome_Msg(Player *player,PacketReader *reader)

{
  pointer *this;
  pointer *this_00;
  Character_Spell CVar1;
  World *pWVar2;
  Character *pCVar3;
  Character_Item CVar4;
  NPC *pNVar5;
  uchar x;
  uchar y;
  bool bVar6;
  short sVar7;
  int num;
  Map *pMVar8;
  undefined8 uVar9;
  list<Character_*,_std::allocator<Character_*>_> *this_01;
  reference ppCVar10;
  vector<NPC_*,_std::allocator<NPC_*>_> *this_02;
  list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *this_03;
  reference psVar11;
  mapped_type *this_04;
  char *pcVar12;
  FILE *__stream;
  ulong uVar13;
  long lVar14;
  size_type sVar15;
  size_type sVar16;
  size_type sVar17;
  size_type sVar18;
  size_type sVar19;
  list<Character_Item,_std::allocator<Character_Item>_> *this_05;
  reference pCVar20;
  list<Character_Spell,_std::allocator<Character_Spell>_> *this_06;
  reference pCVar21;
  reference ppCVar22;
  reference ppNVar23;
  reference psVar24;
  element_type *peVar25;
  undefined1 local_1298 [8];
  shared_ptr<Map_Item> item_2;
  iterator __end1_7;
  iterator __begin1_7;
  vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *__range1_7;
  NPC *npc_1;
  iterator __end1_6;
  iterator __begin1_6;
  vector<NPC_*,_std::allocator<NPC_*>_> *__range1_6;
  string local_1230;
  Character *local_1210;
  Character *character_1;
  iterator __end1_5;
  iterator __begin1_5;
  vector<Character_*,_std::allocator<Character_*>_> *__range1_5;
  iterator iStack_11e8;
  Character_Spell spell;
  iterator __end1_4;
  iterator __begin1_4;
  list<Character_Spell,_std::allocator<Character_Spell>_> *__range1_4;
  Character_Item item_1;
  iterator __end1_3;
  iterator __begin1_3;
  list<Character_Item,_std::allocator<Character_Item>_> *__range1_3;
  string local_11a8;
  undefined1 local_1188 [8];
  string str;
  int i;
  bool newseof;
  FILE *newsfh;
  char newsbuf [4096];
  allocator<char> local_149;
  key_type local_148;
  undefined1 local_128 [8];
  string news_file;
  PacketBuilder reply;
  shared_ptr<Map_Item> item;
  iterator __end1_2;
  iterator __begin1_2;
  list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *__range1_2;
  NPC *npc;
  iterator __end1_1;
  iterator __begin1_1;
  vector<NPC_*,_std::allocator<NPC_*>_> *__range1_1;
  Character *local_80;
  Character *character;
  iterator __end1;
  iterator __begin1;
  list<Character_*,_std::allocator<Character_*>_> *__range1;
  vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> updateitems;
  vector<NPC_*,_std::allocator<NPC_*>_> updatenpcs;
  vector<Character_*,_std::allocator<Character_*>_> updatecharacters;
  PacketReader *reader_local;
  Player *player_local;
  
  PacketReader::GetThree(reader);
  PacketReader::GetInt(reader);
  pMVar8 = World::GetMap(player->character->world,player->character->mapid);
  if ((pMVar8->exists & 1U) == 0) {
    pWVar2 = player->character->world;
    sVar7 = Character::SpawnMap(player->character);
    pMVar8 = World::GetMap(pWVar2,sVar7);
    if ((pMVar8->exists & 1U) == 0) {
      uVar9 = std::__cxx11::string::c_str();
      Console::Wrn("Player logged in to non-existent map (%s, map %i) - Disconnected",uVar9,
                   (ulong)(uint)(int)player->character->mapid);
      Client::Close(&player->client->super_Client,false);
      return;
    }
    uVar9 = std::__cxx11::string::c_str();
    Console::Wrn("Player logged in to non-existent map (%s, map %i) - Position reset",uVar9,
                 (ulong)(uint)(int)player->character->mapid);
    pCVar3 = player->character;
    sVar7 = Character::SpawnMap(player->character);
    x = Character::SpawnX(player->character);
    y = Character::SpawnY(player->character);
    Character::Warp(pCVar3,sVar7,x,y,WARP_ANIMATION_NONE);
  }
  World::Login(player->world,player->character);
  player->client->state = Playing;
  std::vector<Character_*,_std::allocator<Character_*>_>::vector
            ((vector<Character_*,_std::allocator<Character_*>_> *)
             &updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<NPC_*,_std::allocator<NPC_*>_>::vector
            ((vector<NPC_*,_std::allocator<NPC_*>_> *)
             &updateitems.
              super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::vector
            ((vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *)
             &__range1);
  this_01 = &player->character->map->characters;
  __end1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(this_01);
  character = (Character *)
              std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(this_01);
  while (bVar6 = std::operator!=(&__end1,(_Self *)&character), bVar6) {
    ppCVar10 = std::_List_iterator<Character_*>::operator*(&__end1);
    local_80 = *ppCVar10;
    bVar6 = Character::InRange(player->character,local_80);
    if (bVar6) {
      std::vector<Character_*,_std::allocator<Character_*>_>::push_back
                ((vector<Character_*,_std::allocator<Character_*>_> *)
                 &updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_80);
    }
    std::_List_iterator<Character_*>::operator++(&__end1);
  }
  this_02 = &player->character->map->npcs;
  __end1_1 = std::vector<NPC_*,_std::allocator<NPC_*>_>::begin(this_02);
  npc = (NPC *)std::vector<NPC_*,_std::allocator<NPC_*>_>::end(this_02);
  while (bVar6 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                             *)&npc), bVar6) {
    ppNVar23 = __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::
               operator*(&__end1_1);
    __range1_2 = (list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *)
                 *ppNVar23;
    bVar6 = Character::InRange(player->character,(NPC *)__range1_2);
    if (bVar6) {
      std::vector<NPC_*,_std::allocator<NPC_*>_>::push_back
                ((vector<NPC_*,_std::allocator<NPC_*>_> *)
                 &updateitems.
                  super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&__range1_2);
    }
    __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::operator++
              (&__end1_1);
  }
  this_03 = &player->character->map->items;
  __end1_2 = std::__cxx11::
             list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::begin
                       (this_03);
  item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::__cxx11::list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::
       end(this_03);
  while (bVar6 = std::operator!=(&__end1_2,
                                 (_Self *)&item.
                                           super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_refcount), bVar6) {
    psVar11 = std::_List_iterator<std::shared_ptr<Map_Item>_>::operator*(&__end1_2);
    std::shared_ptr<Map_Item>::shared_ptr((shared_ptr<Map_Item> *)&reply.add_size,psVar11);
    pCVar3 = player->character;
    peVar25 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator*((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &reply.add_size);
    bVar6 = Character::InRange(pCVar3,peVar25);
    if (bVar6) {
      std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::push_back
                ((vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *)
                 &__range1,(value_type *)&reply.add_size);
    }
    std::shared_ptr<Map_Item>::~shared_ptr((shared_ptr<Map_Item> *)&reply.add_size);
    std::_List_iterator<std::shared_ptr<Map_Item>_>::operator++(&__end1_2);
  }
  PacketBuilder::PacketBuilder
            ((PacketBuilder *)((long)&news_file.field_2 + 8),PACKET_WELCOME,PACKET_REPLY,0xc);
  PacketBuilder::AddShort((PacketBuilder *)((long)&news_file.field_2 + 8),2);
  PacketBuilder::AddByte((PacketBuilder *)((long)&news_file.field_2 + 8),0xff);
  pWVar2 = player->world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"NewsFile",&local_149);
  this_04 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
            ::operator[](&(pWVar2->config).
                          super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         ,&local_148);
  util::variant::operator_cast_to_string((string *)local_128,this_04);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  memset(&newsfh,0,0x1000);
  pcVar12 = (char *)std::__cxx11::string::c_str();
  __stream = fopen(pcVar12,"rt");
  str.field_2._M_local_buf[0xf] = __stream == (FILE *)0x0;
  if ((bool)str.field_2._M_local_buf[0xf]) {
    uVar9 = std::__cxx11::string::c_str();
    Console::Wrn("Could not load news file \'%s\'",uVar9);
  }
  for (str.field_2._8_4_ = 0; (int)str.field_2._8_4_ < 9; str.field_2._8_4_ = str.field_2._8_4_ + 1)
  {
    if ((str.field_2._M_local_buf[0xf] & 1U) == 0) {
      pcVar12 = fgets((char *)&newsfh,0x1000,__stream);
      if (pcVar12 == (char *)0x0) {
        str.field_2._M_local_buf[0xf] = '\x01';
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_11a8,(char *)&newsfh,(allocator<char> *)((long)&__range1_3 + 7))
        ;
        util::trim((string *)local_1188,&local_11a8);
        std::__cxx11::string::~string((string *)&local_11a8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_3 + 7));
        while (uVar13 = std::__cxx11::string::length(), uVar13 < 2) {
          std::__cxx11::string::operator+=((string *)local_1188,' ');
        }
        lVar14 = std::__cxx11::string::length();
        PacketBuilder::ReserveMore
                  ((PacketBuilder *)((long)&news_file.field_2 + 8),
                   (lVar14 - (int)str.field_2._8_4_) + 9);
        PacketBuilder::AddBreakString
                  ((PacketBuilder *)((long)&news_file.field_2 + 8),(string *)local_1188,0xff);
        std::__cxx11::string::~string((string *)local_1188);
      }
    }
    if ((str.field_2._M_local_buf[0xf] & 1U) != 0) {
      PacketBuilder::AddByte((PacketBuilder *)((long)&news_file.field_2 + 8),0xff);
    }
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  sVar15 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::size
                     (&player->character->inventory);
  sVar16 = std::__cxx11::list<Character_Spell,_std::allocator<Character_Spell>_>::size
                     (&player->character->spells);
  sVar17 = std::vector<Character_*,_std::allocator<Character_*>_>::size
                     ((vector<Character_*,_std::allocator<Character_*>_> *)
                      &updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  sVar18 = std::vector<NPC_*,_std::allocator<NPC_*>_>::size
                     ((vector<NPC_*,_std::allocator<NPC_*>_> *)
                      &updateitems.
                       super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar19 = std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::size
                     ((vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                       *)&__range1);
  PacketBuilder::ReserveMore
            ((PacketBuilder *)((long)&news_file.field_2 + 8),
             sVar16 * 4 + sVar15 * 6 + sVar17 * 0x3c + sVar18 * 6 + 7 + sVar19 * 9);
  PacketBuilder::AddChar((PacketBuilder *)((long)&news_file.field_2 + 8),player->character->weight);
  PacketBuilder::AddChar
            ((PacketBuilder *)((long)&news_file.field_2 + 8),player->character->maxweight);
  this_05 = &player->character->inventory;
  __end1_3 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::begin(this_05);
  item_1 = (Character_Item)
           std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::end(this_05);
  while (bVar6 = std::operator!=(&__end1_3,(_Self *)&item_1), bVar6) {
    pCVar20 = std::_List_iterator<Character_Item>::operator*(&__end1_3);
    CVar4 = *pCVar20;
    __range1_4._0_2_ = CVar4.id;
    PacketBuilder::AddShort((PacketBuilder *)((long)&news_file.field_2 + 8),(int)(short)__range1_4);
    __range1_4._4_4_ = CVar4.amount;
    PacketBuilder::AddInt((PacketBuilder *)((long)&news_file.field_2 + 8),__range1_4._4_4_);
    std::_List_iterator<Character_Item>::operator++(&__end1_3);
  }
  PacketBuilder::AddByte((PacketBuilder *)((long)&news_file.field_2 + 8),0xff);
  this_06 = &player->character->spells;
  __end1_4 = std::__cxx11::list<Character_Spell,_std::allocator<Character_Spell>_>::begin(this_06);
  iStack_11e8 = std::__cxx11::list<Character_Spell,_std::allocator<Character_Spell>_>::end(this_06);
  while (bVar6 = std::operator!=(&__end1_4,&stack0xffffffffffffee18), bVar6) {
    pCVar21 = std::_List_iterator<Character_Spell>::operator*(&__end1_4);
    CVar1 = *pCVar21;
    __range1_5._4_2_ = CVar1.id;
    PacketBuilder::AddShort((PacketBuilder *)((long)&news_file.field_2 + 8),(int)__range1_5._4_2_);
    PacketBuilder::AddShort
              ((PacketBuilder *)((long)&news_file.field_2 + 8),(uint)CVar1 >> 0x10 & 0xff);
    std::_List_iterator<Character_Spell>::operator++(&__end1_4);
  }
  PacketBuilder::AddByte((PacketBuilder *)((long)&news_file.field_2 + 8),0xff);
  sVar15 = std::vector<Character_*,_std::allocator<Character_*>_>::size
                     ((vector<Character_*,_std::allocator<Character_*>_> *)
                      &updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  PacketBuilder::AddChar((PacketBuilder *)((long)&news_file.field_2 + 8),(int)sVar15);
  PacketBuilder::AddByte((PacketBuilder *)((long)&news_file.field_2 + 8),0xff);
  this = &updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  __end1_5 = std::vector<Character_*,_std::allocator<Character_*>_>::begin
                       ((vector<Character_*,_std::allocator<Character_*>_> *)this);
  character_1 = (Character *)
                std::vector<Character_*,_std::allocator<Character_*>_>::end
                          ((vector<Character_*,_std::allocator<Character_*>_> *)this);
  while (bVar6 = __gnu_cxx::operator!=
                           (&__end1_5,
                            (__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                             *)&character_1), bVar6) {
    ppCVar22 = __gnu_cxx::
               __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
               ::operator*(&__end1_5);
    local_1210 = *ppCVar22;
    (*(local_1210->super_Command_Source)._vptr_Command_Source[2])(&local_1230);
    PacketBuilder::AddBreakString((PacketBuilder *)((long)&news_file.field_2 + 8),&local_1230,0xff);
    std::__cxx11::string::~string((string *)&local_1230);
    num = Character::PlayerID(local_1210);
    PacketBuilder::AddShort((PacketBuilder *)((long)&news_file.field_2 + 8),num);
    PacketBuilder::AddShort((PacketBuilder *)((long)&news_file.field_2 + 8),(int)local_1210->mapid);
    PacketBuilder::AddShort((PacketBuilder *)((long)&news_file.field_2 + 8),(uint)local_1210->x);
    PacketBuilder::AddShort((PacketBuilder *)((long)&news_file.field_2 + 8),(uint)local_1210->y);
    PacketBuilder::AddChar
              ((PacketBuilder *)((long)&news_file.field_2 + 8),(uint)local_1210->direction);
    PacketBuilder::AddChar((PacketBuilder *)((long)&news_file.field_2 + 8),6);
    Character::PaddedGuildTag_abi_cxx11_((string *)&__range1_6,local_1210);
    PacketBuilder::AddString((PacketBuilder *)((long)&news_file.field_2 + 8),(string *)&__range1_6);
    std::__cxx11::string::~string((string *)&__range1_6);
    PacketBuilder::AddChar((PacketBuilder *)((long)&news_file.field_2 + 8),(uint)local_1210->level);
    PacketBuilder::AddChar((PacketBuilder *)((long)&news_file.field_2 + 8),(uint)local_1210->gender)
    ;
    PacketBuilder::AddChar
              ((PacketBuilder *)((long)&news_file.field_2 + 8),(uint)local_1210->hairstyle);
    PacketBuilder::AddChar
              ((PacketBuilder *)((long)&news_file.field_2 + 8),(uint)local_1210->haircolor);
    PacketBuilder::AddChar((PacketBuilder *)((long)&news_file.field_2 + 8),(uint)local_1210->race);
    PacketBuilder::AddShort((PacketBuilder *)((long)&news_file.field_2 + 8),local_1210->maxhp);
    PacketBuilder::AddShort((PacketBuilder *)((long)&news_file.field_2 + 8),local_1210->hp);
    PacketBuilder::AddShort((PacketBuilder *)((long)&news_file.field_2 + 8),local_1210->maxtp);
    PacketBuilder::AddShort((PacketBuilder *)((long)&news_file.field_2 + 8),local_1210->tp);
    Character::AddPaperdollData
              (local_1210,(PacketBuilder *)((long)&news_file.field_2 + 8),"B000A0HSW");
    PacketBuilder::AddChar
              ((PacketBuilder *)((long)&news_file.field_2 + 8),(uint)local_1210->sitting);
    bVar6 = Character::IsHideInvisible(local_1210);
    PacketBuilder::AddChar((PacketBuilder *)((long)&news_file.field_2 + 8),(uint)bVar6);
    PacketBuilder::AddByte((PacketBuilder *)((long)&news_file.field_2 + 8),0xff);
    __gnu_cxx::
    __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
    operator++(&__end1_5);
  }
  this_00 = &updateitems.
             super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end1_6 = std::vector<NPC_*,_std::allocator<NPC_*>_>::begin
                       ((vector<NPC_*,_std::allocator<NPC_*>_> *)this_00);
  npc_1 = (NPC *)std::vector<NPC_*,_std::allocator<NPC_*>_>::end
                           ((vector<NPC_*,_std::allocator<NPC_*>_> *)this_00);
  while (bVar6 = __gnu_cxx::operator!=
                           (&__end1_6,
                            (__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                             *)&npc_1), bVar6) {
    ppNVar23 = __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::
               operator*(&__end1_6);
    pNVar5 = *ppNVar23;
    if ((pNVar5->alive & 1U) != 0) {
      PacketBuilder::AddChar((PacketBuilder *)((long)&news_file.field_2 + 8),(uint)pNVar5->index);
      PacketBuilder::AddShort((PacketBuilder *)((long)&news_file.field_2 + 8),pNVar5->id);
      PacketBuilder::AddChar((PacketBuilder *)((long)&news_file.field_2 + 8),(uint)pNVar5->x);
      PacketBuilder::AddChar((PacketBuilder *)((long)&news_file.field_2 + 8),(uint)pNVar5->y);
      PacketBuilder::AddChar
                ((PacketBuilder *)((long)&news_file.field_2 + 8),(uint)pNVar5->direction);
    }
    __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::operator++
              (&__end1_6);
  }
  PacketBuilder::AddByte((PacketBuilder *)((long)&news_file.field_2 + 8),0xff);
  __end1_7 = std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::
             begin((vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *
                   )&__range1);
  item_2.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::end
                 ((vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *)
                  &__range1);
  while (bVar6 = __gnu_cxx::operator!=
                           (&__end1_7,
                            (__normal_iterator<std::shared_ptr<Map_Item>_*,_std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>_>
                             *)&item_2.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount), bVar6) {
    psVar24 = __gnu_cxx::
              __normal_iterator<std::shared_ptr<Map_Item>_*,_std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>_>
              ::operator*(&__end1_7);
    std::shared_ptr<Map_Item>::shared_ptr((shared_ptr<Map_Item> *)local_1298,psVar24);
    peVar25 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         local_1298);
    PacketBuilder::AddShort((PacketBuilder *)((long)&news_file.field_2 + 8),(int)peVar25->uid);
    peVar25 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         local_1298);
    PacketBuilder::AddShort((PacketBuilder *)((long)&news_file.field_2 + 8),(int)peVar25->id);
    peVar25 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         local_1298);
    PacketBuilder::AddChar((PacketBuilder *)((long)&news_file.field_2 + 8),(uint)peVar25->x);
    peVar25 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         local_1298);
    PacketBuilder::AddChar((PacketBuilder *)((long)&news_file.field_2 + 8),(uint)peVar25->y);
    peVar25 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         local_1298);
    PacketBuilder::AddThree((PacketBuilder *)((long)&news_file.field_2 + 8),peVar25->amount);
    std::shared_ptr<Map_Item>::~shared_ptr((shared_ptr<Map_Item> *)local_1298);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Map_Item>_*,_std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>_>
    ::operator++(&__end1_7);
  }
  Player::Send(player,(PacketBuilder *)((long)&news_file.field_2 + 8));
  std::__cxx11::string::~string((string *)local_128);
  PacketBuilder::~PacketBuilder((PacketBuilder *)((long)&news_file.field_2 + 8));
  std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::~vector
            ((vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *)
             &__range1);
  std::vector<NPC_*,_std::allocator<NPC_*>_>::~vector
            ((vector<NPC_*,_std::allocator<NPC_*>_> *)
             &updateitems.
              super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<Character_*,_std::allocator<Character_*>_>::~vector
            ((vector<Character_*,_std::allocator<Character_*>_> *)
             &updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Welcome_Msg(Player *player, PacketReader &reader)
{
	reader.GetThree(); // ??
	/*unsigned int id =*/ reader.GetInt(); // Character ID

	if (!player->character->world->GetMap(player->character->mapid)->exists)
	{
		if (player->character->world->GetMap(player->character->SpawnMap())->exists)
		{
			Console::Wrn("Player logged in to non-existent map (%s, map %i) - Position reset", player->character->real_name.c_str(), player->character->mapid);
			player->character->Warp(player->character->SpawnMap(), player->character->SpawnX(), player->character->SpawnY());
		}
		else
		{
			Console::Wrn("Player logged in to non-existent map (%s, map %i) - Disconnected", player->character->real_name.c_str(), player->character->mapid);
			player->client->Close();
			return;
		}
	}

	player->world->Login(player->character);

	player->client->state = EOClient::Playing;

	std::vector<Character *> updatecharacters;
	std::vector<NPC *> updatenpcs;
	std::vector<std::shared_ptr<Map_Item>> updateitems;

	UTIL_FOREACH(player->character->map->characters, character)
	{
		if (player->character->InRange(character))
		{
			updatecharacters.push_back(character);
		}
	}

	UTIL_FOREACH(player->character->map->npcs, npc)
	{
		if (player->character->InRange(npc))
		{
			updatenpcs.push_back(npc);
		}
	}

	UTIL_FOREACH(player->character->map->items, item)
	{
		if (player->character->InRange(*item))
		{
			updateitems.push_back(item);
		}
	}

	PacketBuilder reply(PACKET_WELCOME, PACKET_REPLY, 3 + 9);

	reply.AddShort(2); // REPLY_WELCOME sub-id
	// MotDs
	reply.AddByte(255);

	std::string news_file = player->world->config["NewsFile"];

	char newsbuf[4096] = "";
	std::FILE *newsfh = std::fopen(news_file.c_str(), "rt");
	bool newseof = (newsfh == 0);

	if (newseof)
	{
		Console::Wrn("Could not load news file '%s'", news_file.c_str());
	}

	for (int i = 0; i < 9; ++i)
	{
		if (!newseof)
		{
			if (!std::fgets(newsbuf, 4096, newsfh))
			{
				newseof = true;
			}
			else
			{
				std::string str = util::trim(newsbuf);

				while (str.length() < 2)
					str += ' ';

				reply.ReserveMore(str.length() + 9 - i);
				reply.AddBreakString(str);
			}
		}

		if (newseof)
		{
			reply.AddByte(255);
		}
	}

	if (newsfh)
	{
		std::fclose(newsfh);
	}

	reply.ReserveMore(7 + player->character->inventory.size() * 6 + player->character->spells.size() * 4
		+ updatecharacters.size() * 60 + updatenpcs.size() * 6 + updateitems.size() * 9);

	// ??
	reply.AddChar(player->character->weight); // Weight
	reply.AddChar(player->character->maxweight); // Max Weight
	UTIL_FOREACH(player->character->inventory, item)
	{
		reply.AddShort(item.id);
		reply.AddInt(item.amount);
	}
	reply.AddByte(255);
	UTIL_FOREACH(player->character->spells, spell)
	{
		reply.AddShort(spell.id); // Spell ID
		reply.AddShort(spell.level); // Spell Level
	}
	reply.AddByte(255);

	reply.AddChar(updatecharacters.size()); // Number of players
	reply.AddByte(255);
	UTIL_FOREACH(updatecharacters, character)
	{
		reply.AddBreakString(character->SourceName());
		reply.AddShort(character->PlayerID());
		reply.AddShort(character->mapid);
		reply.AddShort(character->x);
		reply.AddShort(character->y);
		reply.AddChar(character->direction);
		reply.AddChar(6); // ?
		reply.AddString(character->PaddedGuildTag());
		reply.AddChar(character->level);
		reply.AddChar(character->gender);
		reply.AddChar(character->hairstyle);
		reply.AddChar(character->haircolor);
		reply.AddChar(character->race);
		reply.AddShort(character->maxhp);
		reply.AddShort(character->hp);
		reply.AddShort(character->maxtp);
		reply.AddShort(character->tp);
		// equipment
		character->AddPaperdollData(reply, "B000A0HSW");

		reply.AddChar(character->sitting);
		reply.AddChar(character->IsHideInvisible());
		reply.AddByte(255);
	}
	UTIL_FOREACH(updatenpcs, npc)
	{
		if (npc->alive)
		{
			reply.AddChar(npc->index);
			reply.AddShort(npc->id);
			reply.AddChar(npc->x);
			reply.AddChar(npc->y);
			reply.AddChar(npc->direction);
		}
	}
	reply.AddByte(255);
	UTIL_FOREACH(updateitems, item)
	{
		reply.AddShort(item->uid);
		reply.AddShort(item->id);
		reply.AddChar(item->x);
		reply.AddChar(item->y);
		reply.AddThree(item->amount);
	}
	player->Send(reply);
}